

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O1

void __thiscall MediaManager::MediaManager(MediaManager *this,DataContainer *container)

{
  (this->super_ITypeManager)._vptr_ITypeManager = (_func_int **)&PTR_GetTypeFromFile_001829a8;
  this->container_ = container;
  (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->media_list_).super__Vector_base<IMedia_*,_std::allocator<IMedia_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Init(this);
  return;
}

Assistant:

MediaManager::MediaManager(DataContainer* container): container_(container)
{
   Init();
}